

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O0

void N_VCompare_MultiFab(Real a,N_Vector x,N_Vector z)

{
  bool bVar1;
  MultiFab **ppMVar2;
  N_Vector in_RSI;
  N_Vector in_RDI;
  pointer in_XMM0_Qa;
  Dim3 hi;
  Dim3 lo;
  Array4<double> *z_fab;
  Array4<double> *x_fab;
  Box *bx;
  MFIter mfi;
  sunindextype ncomp;
  MultiFab *mf_z;
  MultiFab *mf_x;
  MFIter *in_stack_fffffffffffffd20;
  FabArray<amrex::FArrayBox> *this;
  MFIter *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd44;
  uchar flags_;
  FabArrayBase *in_stack_fffffffffffffd48;
  MFIter *in_stack_fffffffffffffd50;
  anon_class_136_3_7a072d9f *in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd74;
  Box *in_stack_fffffffffffffd78;
  undefined1 auStack_278 [64];
  pointer local_238;
  _Bit_pointer local_230;
  int local_228;
  _Bit_pointer local_21c;
  int local_214;
  FArrayBox *local_210;
  undefined4 local_208;
  FArrayBox *local_200;
  undefined4 local_1f8;
  undefined1 local_1f0 [136];
  MFIter *local_168;
  undefined1 local_15c [36];
  undefined1 local_138 [172];
  undefined4 local_8c;
  uint uStack_88;
  undefined4 local_84;
  _Bit_pointer local_80;
  int local_78;
  Array4<const_double> *local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  int local_60;
  undefined4 local_5c;
  undefined1 *local_58;
  undefined4 local_4c;
  __uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  local_48;
  undefined4 local_3c;
  undefined8 *local_38;
  undefined4 local_2c;
  Array4<const_double> *local_28;
  undefined4 local_1c;
  Array4<const_double> *local_18;
  undefined4 local_c;
  MultiArray4<const_double> local_8;
  
  flags_ = (uchar)((uint)in_stack_fffffffffffffd44 >> 0x18);
  local_138._120_8_ = in_RSI;
  local_138._136_8_ = in_XMM0_Qa;
  ppMVar2 = amrex::sundials::getMFptr(in_RDI);
  local_138._112_8_ = *ppMVar2;
  ppMVar2 = amrex::sundials::getMFptr((N_Vector)local_138._120_8_);
  local_138._104_8_ = *ppMVar2;
  local_138._100_4_ = amrex::FabArrayBase::nComp((FabArrayBase *)local_138._112_8_);
  amrex::MFIter::MFIter(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,flags_);
  while( true ) {
    bVar1 = amrex::MFIter::isValid((MFIter *)local_138);
    if (!bVar1) break;
    this = (FabArray<amrex::FArrayBox> *)local_138;
    amrex::MFIter::validbox(in_stack_fffffffffffffd30);
    in_stack_fffffffffffffd20 = (MFIter *)(local_1f0 + 0x48);
    local_15c._28_8_ = (Array4<const_double> *)local_15c;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(this,in_stack_fffffffffffffd20);
    in_stack_fffffffffffffd30 = (MFIter *)local_1f0;
    local_168 = in_stack_fffffffffffffd20;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(this,in_stack_fffffffffffffd20);
    local_138._160_8_ = local_15c._28_8_;
    local_8.hp = (Array4<const_double> *)local_15c._28_8_;
    local_c = 0;
    local_8c = *(undefined4 *)(double **)local_15c._28_8_;
    local_18 = (Array4<const_double> *)local_15c._28_8_;
    local_1c = 1;
    uStack_88 = *(uint *)((long)(double **)local_15c._28_8_ + 4);
    local_210 = (FArrayBox *)*(double **)local_15c._28_8_;
    local_28 = (Array4<const_double> *)local_15c._28_8_;
    local_2c = 2;
    local_208 = *(undefined4 *)(local_15c._28_8_ + 8);
    local_70 = (Array4<const_double> *)local_15c._28_8_;
    local_38 = (undefined8 *)((long)(local_15c._28_8_ + 8) + 4);
    local_3c = 0;
    local_68 = *(undefined4 *)local_38;
    local_48._M_t.
    super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
         (tuple<amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
          )((long)(local_15c._28_8_ + 8) + 4);
    local_4c._0_1_ = true;
    local_4c._1_3_ = 0;
    uStack_64 = (undefined4)*(Long *)(local_15c._28_8_ + 0x10);
    local_230 = (_Bit_pointer)*local_38;
    local_58 = (undefined1 *)((long)(local_15c._28_8_ + 8) + 4);
    local_5c = 2;
    local_228 = *(int *)((long)(local_15c._28_8_ + 0x10) + 4);
    local_21c = local_230;
    local_214 = local_228;
    local_200 = local_210;
    local_1f8 = local_208;
    local_1f0._64_8_ = in_stack_fffffffffffffd30;
    local_138._144_8_ = local_210;
    local_138._152_4_ = local_208;
    local_84 = local_208;
    local_80 = local_230;
    local_78 = local_228;
    local_60 = local_228;
    memcpy(&stack0xfffffffffffffd48,in_stack_fffffffffffffd30,0x3c);
    memcpy(auStack_278,local_168,0x3c);
    local_238 = (pointer)local_138._136_8_;
    amrex::ParallelFor<int,N_VCompare_MultiFab::__0,void>
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,in_stack_fffffffffffffd68);
    amrex::MFIter::operator++((MFIter *)local_138);
  }
  amrex::MFIter::~MFIter(in_stack_fffffffffffffd20);
  return;
}

Assistant:

void N_VCompare_MultiFab(amrex::Real a, N_Vector x, N_Vector z)
{
    using namespace amrex;

    amrex::MultiFab *mf_x = amrex::sundials::getMFptr(x);
    amrex::MultiFab *mf_z = amrex::sundials::getMFptr(z);
    sunindextype ncomp = mf_x->nComp();

    // ghost cells not included
    for (MFIter mfi(*mf_x); mfi.isValid(); ++mfi)
    {
         const amrex::Box& bx = mfi.validbox();
         Array4<Real> const& x_fab = mf_x->array(mfi);
         Array4<Real> const& z_fab = mf_z->array(mfi);
         const auto lo = lbound(bx);
         const auto hi = ubound(bx);

         amrex::ParallelFor(bx, ncomp,
         [=] AMREX_GPU_DEVICE (int i, int j, int k, int c) noexcept
         {
           z_fab(i,j,k,c) = (SUNRabs(x_fab(i,j,k,c)) >= a) ? amrex::Real(1.0) : amrex::Real(0.0);
         });
    }

    return;
}